

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
vkt::(anonymous_namespace)::generateVertexSpecialization_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,
          ProgramSpecializationParams *specParams)

{
  _Rb_tree_header *p_Var1;
  DataType dataType;
  long lVar2;
  long lVar3;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *p_Var4;
  DataType dataType_00;
  char *pcVar5;
  char *pcVar6;
  ostream *poVar7;
  long lVar8;
  ulong uVar9;
  string *psVar10;
  allocator<char> local_3a5;
  int local_3a4;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_3a0;
  int local_394;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  _anonymous_namespace_ *local_370;
  ulong local_368;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_360;
  ostringstream decl;
  ostringstream setup;
  
  local_370 = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&decl);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&setup);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3a0 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
               *)__return_storage_ptr__;
  std::operator<<((ostream *)&decl,"layout(location = 0) in highp vec4 dEQP_Position;\n");
  local_3a4 = 1;
  lVar8 = 0x18;
  uVar9 = 0;
  while( true ) {
    lVar2 = *(long *)local_370;
    lVar3 = *(long *)(lVar2 + 0x30);
    if ((ulong)((*(long *)(lVar2 + 0x38) - lVar3) / 0x50) <= uVar9) break;
    dataType = *(DataType *)(lVar3 + -0x10 + lVar8);
    local_368 = uVar9;
    pcVar5 = glu::getDataTypeName(dataType);
    dataType_00 = vkt::anon_unknown_0::getTransportType(dataType);
    pcVar6 = glu::getDataTypeName(dataType_00);
    local_394 = vkt::anon_unknown_0::getNumTransportLocations(dataType);
    poVar7 = std::operator<<((ostream *)&decl,"layout(location = ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_3a4);
    std::operator<<(poVar7,") in ");
    if (dataType == dataType_00) {
      poVar7 = std::operator<<((ostream *)&decl,pcVar6);
      poVar7 = std::operator<<(poVar7," ");
      poVar7 = std::operator<<(poVar7,(string *)(lVar3 + lVar8));
      pcVar5 = ";\n";
    }
    else {
      poVar7 = std::operator<<((ostream *)&decl,pcVar6);
      poVar7 = std::operator<<(poVar7," a_");
      psVar10 = (string *)(lVar3 + lVar8);
      poVar7 = std::operator<<(poVar7,psVar10);
      std::operator<<(poVar7,";\n");
      poVar7 = std::operator<<((ostream *)&setup,pcVar5);
      poVar7 = std::operator<<(poVar7," ");
      poVar7 = std::operator<<(poVar7,psVar10);
      poVar7 = std::operator<<(poVar7," = ");
      poVar7 = std::operator<<(poVar7,pcVar5);
      poVar7 = std::operator<<(poVar7,"(a_");
      poVar7 = std::operator<<(poVar7,psVar10);
      pcVar5 = ");\n";
    }
    std::operator<<(poVar7,pcVar5);
    local_3a4 = local_3a4 + local_394;
    uVar9 = local_368 + 1;
    lVar8 = lVar8 + 0x50;
  }
  vkt::anon_unknown_0::declareUniforms(&decl,(ValueBlock *)(lVar2 + 0x30));
  std::__cxx11::stringbuf::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[20],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_360,(char (*) [20])"VERTEX_DECLARATIONS",&local_390);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>(local_3a0,&local_360);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_360);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::stringbuf::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_360,(char (*) [13])"VERTEX_SETUP",&local_390);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>(local_3a0,&local_360);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_360);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_390,"gl_Position = dEQP_Position;\n",&local_3a5);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_360,(char (*) [14])"VERTEX_OUTPUT",&local_390);
  p_Var4 = local_3a0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>(local_3a0,&local_360);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_360);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&setup);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&decl);
  return (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)p_Var4;
}

Assistant:

map<string, string> generateVertexSpecialization (const ProgramSpecializationParams& specParams)
{
	ostringstream			decl;
	ostringstream			setup;
	map<string, string>		params;
	int						curInputLoc		= 0;

	decl << "layout(location = 0) in highp vec4 dEQP_Position;\n";
	curInputLoc += 1;

	for (size_t ndx = 0; ndx < specParams.caseSpec.values.inputs.size(); ndx++)
	{
		const Value&		val					= specParams.caseSpec.values.inputs[ndx];
		const DataType		valueType			= val.type.getBasicType();
		const char*	const	valueTypeStr		= getDataTypeName(valueType);
		const DataType		transportType		= getTransportType(valueType);
		const char* const	transportTypeStr	= getDataTypeName(transportType);
		const int			numLocs				= getNumTransportLocations(valueType);

		decl << "layout(location = " << curInputLoc << ") in ";

		curInputLoc += numLocs;

		if (valueType == transportType)
			decl << transportTypeStr << " " << val.name << ";\n";
		else
		{
			decl << transportTypeStr << " a_" << val.name << ";\n";
			setup << valueTypeStr << " " << val.name << " = " << valueTypeStr << "(a_" << val.name << ");\n";
		}
	}

	declareUniforms(decl, specParams.caseSpec.values);

	params.insert(pair<string, string>("VERTEX_DECLARATIONS",	decl.str()));
	params.insert(pair<string, string>("VERTEX_SETUP",			setup.str()));
	params.insert(pair<string, string>("VERTEX_OUTPUT",			string("gl_Position = dEQP_Position;\n")));

	return params;
}